

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

bool __thiscall
spirv_cross::CompilerGLSL::should_force_emit_builtin_block(CompilerGLSL *this,StorageClass storage)

{
  ExecutionModel EVar1;
  anon_class_24_3_a269e0a3 local_38;
  bool local_1d;
  StorageClass local_1c;
  bool should_force;
  CompilerGLSL *pCStack_18;
  StorageClass storage_local;
  CompilerGLSL *this_local;
  
  if (storage == StorageClassOutput) {
    local_1d = false;
    local_38.should_force = &local_1d;
    local_38.storage = &local_1c;
    local_38.this = this;
    local_1c = storage;
    pCStack_18 = this;
    ParsedIR::
    for_each_typed_id<spirv_cross::SPIRVariable,spirv_cross::CompilerGLSL::should_force_emit_builtin_block(spv::StorageClass)::__0>
              (&(this->super_Compiler).ir,&local_38);
    EVar1 = Compiler::get_execution_model(&this->super_Compiler);
    if (((EVar1 == ExecutionModelTessellationControl) ||
        (EVar1 = Compiler::get_execution_model(&this->super_Compiler),
        EVar1 == ExecutionModelMeshEXT)) &&
       (((this->super_Compiler).clip_distance_count != 0 ||
        ((this->super_Compiler).cull_distance_count != 0)))) {
      local_1d = true;
    }
    EVar1 = Compiler::get_execution_model(&this->super_Compiler);
    if ((EVar1 == ExecutionModelMeshEXT) && (((this->super_Compiler).position_invariant & 1U) != 0))
    {
      local_1d = true;
    }
    return (bool)(local_1d & 1);
  }
  return false;
}

Assistant:

bool CompilerGLSL::should_force_emit_builtin_block(StorageClass storage)
{
	// If the builtin block uses XFB, we need to force explicit redeclaration of the builtin block.

	if (storage != StorageClassOutput)
		return false;
	bool should_force = false;

	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		if (should_force)
			return;

		auto &type = this->get<SPIRType>(var.basetype);
		bool block = has_decoration(type.self, DecorationBlock);
		if (var.storage == storage && block && is_builtin_variable(var))
		{
			uint32_t member_count = uint32_t(type.member_types.size());
			for (uint32_t i = 0; i < member_count; i++)
			{
				if (has_member_decoration(type.self, i, DecorationBuiltIn) &&
				    is_block_builtin(BuiltIn(get_member_decoration(type.self, i, DecorationBuiltIn))) &&
				    has_member_decoration(type.self, i, DecorationOffset))
				{
					should_force = true;
				}
			}
		}
		else if (var.storage == storage && !block && is_builtin_variable(var))
		{
			if (is_block_builtin(BuiltIn(get_decoration(type.self, DecorationBuiltIn))) &&
			    has_decoration(var.self, DecorationOffset))
			{
				should_force = true;
			}
		}
	});

	// If we're declaring clip/cull planes with control points we need to force block declaration.
	if ((get_execution_model() == ExecutionModelTessellationControl ||
	     get_execution_model() == ExecutionModelMeshEXT) &&
	    (clip_distance_count || cull_distance_count))
	{
		should_force = true;
	}

	// Either glslang bug or oversight, but global invariant position does not work in mesh shaders.
	if (get_execution_model() == ExecutionModelMeshEXT && position_invariant)
		should_force = true;

	return should_force;
}